

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDParameters.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::RNEMDParameters::RNEMDParameters(RNEMDParameters *this)

{
  ParamMap *this_00;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar2;
  allocator<char> local_159;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_138;
  ParameterBase *local_110;
  ParameterBase *local_108;
  ParameterBase *local_100;
  ParameterBase *local_f8;
  ParameterBase *local_f0;
  ParameterBase *local_e8;
  ParameterBase *local_e0;
  ParameterBase *local_d8;
  ParameterBase *local_d0;
  ParameterBase *local_c8;
  ParameterBase *local_c0;
  ParameterBase *local_b8;
  ParameterBase *local_b0;
  ParameterBase *local_a8;
  ParameterBase *local_a0;
  ParameterBase *local_98;
  ParameterBase *local_90;
  ParameterBase *local_88;
  ParameterBase *local_80;
  ParameterBase *local_78;
  ParameterBase *local_70;
  ParameterBase *local_68;
  ParameterBase *local_60;
  ParameterBase *local_58;
  ParameterBase *local_50;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  ParameterBase *local_40;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__RNEMDParameters_002c0d28;
  (this->UseRNEMD).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseRNEMD).super_ParameterBase.keyword_.field_2;
  (this->UseRNEMD).super_ParameterBase.keyword_._M_string_length = 0;
  local_40 = &(this->UseRNEMD).super_ParameterBase;
  (this->UseRNEMD).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseRNEMD).super_ParameterBase.optional_ = false;
  (this->UseRNEMD).super_ParameterBase.defaultValue_ = false;
  (this->UseRNEMD).super_ParameterBase.empty_ = true;
  (this->UseRNEMD).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd4d8;
  local_38 = &this->ObjectSelection;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_38);
  local_f0 = &(this->OutputSelection).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_f0);
  local_48 = &this->Method;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_48);
  local_50 = &(this->FluxType).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_50);
  local_58 = &(this->ExchangeTime).super_ParameterBase;
  (this->ExchangeTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ExchangeTime).super_ParameterBase.keyword_.field_2;
  (this->ExchangeTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ExchangeTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ExchangeTime).super_ParameterBase.optional_ = false;
  (this->ExchangeTime).super_ParameterBase.defaultValue_ = false;
  (this->ExchangeTime).super_ParameterBase.empty_ = true;
  (this->ExchangeTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->KineticFlux).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->KineticFlux).super_ParameterBase.keyword_.field_2;
  (this->KineticFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->KineticFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->KineticFlux).super_ParameterBase.optional_ = false;
  (this->KineticFlux).super_ParameterBase.defaultValue_ = false;
  local_60 = &(this->KineticFlux).super_ParameterBase;
  (this->KineticFlux).super_ParameterBase.empty_ = true;
  (this->KineticFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->ParticleFlux).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ParticleFlux).super_ParameterBase.keyword_.field_2;
  (this->ParticleFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ParticleFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ParticleFlux).super_ParameterBase.optional_ = false;
  (this->ParticleFlux).super_ParameterBase.defaultValue_ = false;
  local_68 = &(this->ParticleFlux).super_ParameterBase;
  (this->ParticleFlux).super_ParameterBase.empty_ = true;
  (this->ParticleFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->CurrentDensity).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->CurrentDensity).super_ParameterBase.keyword_.field_2;
  (this->CurrentDensity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CurrentDensity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CurrentDensity).super_ParameterBase.optional_ = false;
  (this->CurrentDensity).super_ParameterBase.defaultValue_ = false;
  local_70 = &(this->CurrentDensity).super_ParameterBase;
  (this->CurrentDensity).super_ParameterBase.empty_ = true;
  (this->CurrentDensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->MomentumFlux).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MomentumFlux).super_ParameterBase.keyword_.field_2;
  (this->MomentumFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MomentumFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MomentumFlux).super_ParameterBase.optional_ = false;
  (this->MomentumFlux).super_ParameterBase.defaultValue_ = false;
  local_78 = &(this->MomentumFlux).super_ParameterBase;
  (this->MomentumFlux).super_ParameterBase.empty_ = true;
  (this->MomentumFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  local_80 = &(this->MomentumFluxVector).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_80);
  (this->AngularMomentumFlux).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->AngularMomentumFlux).super_ParameterBase.keyword_.field_2;
  (this->AngularMomentumFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AngularMomentumFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AngularMomentumFlux).super_ParameterBase.optional_ = false;
  (this->AngularMomentumFlux).super_ParameterBase.defaultValue_ = false;
  local_88 = &(this->AngularMomentumFlux).super_ParameterBase;
  (this->AngularMomentumFlux).super_ParameterBase.empty_ = true;
  (this->AngularMomentumFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  local_90 = &(this->AngularMomentumFluxVector).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_90);
  (this->SlabWidth).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SlabWidth).super_ParameterBase.keyword_.field_2;
  (this->SlabWidth).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SlabWidth).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SlabWidth).super_ParameterBase.optional_ = false;
  (this->SlabWidth).super_ParameterBase.defaultValue_ = false;
  local_98 = &(this->SlabWidth).super_ParameterBase;
  (this->SlabWidth).super_ParameterBase.empty_ = true;
  (this->SlabWidth).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->SlabACenter).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SlabACenter).super_ParameterBase.keyword_.field_2;
  (this->SlabACenter).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SlabACenter).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SlabACenter).super_ParameterBase.optional_ = false;
  (this->SlabACenter).super_ParameterBase.defaultValue_ = false;
  local_a0 = &(this->SlabACenter).super_ParameterBase;
  (this->SlabACenter).super_ParameterBase.empty_ = true;
  (this->SlabACenter).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->SlabBCenter).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SlabBCenter).super_ParameterBase.keyword_.field_2;
  (this->SlabBCenter).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SlabBCenter).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SlabBCenter).super_ParameterBase.optional_ = false;
  (this->SlabBCenter).super_ParameterBase.defaultValue_ = false;
  local_a8 = &(this->SlabBCenter).super_ParameterBase;
  (this->SlabBCenter).super_ParameterBase.empty_ = true;
  (this->SlabBCenter).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->SphereARadius).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SphereARadius).super_ParameterBase.keyword_.field_2;
  (this->SphereARadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SphereARadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SphereARadius).super_ParameterBase.optional_ = false;
  (this->SphereARadius).super_ParameterBase.defaultValue_ = false;
  local_b0 = &(this->SphereARadius).super_ParameterBase;
  (this->SphereARadius).super_ParameterBase.empty_ = true;
  (this->SphereARadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  (this->SphereBRadius).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SphereBRadius).super_ParameterBase.keyword_.field_2;
  (this->SphereBRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SphereBRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SphereBRadius).super_ParameterBase.optional_ = false;
  (this->SphereBRadius).super_ParameterBase.defaultValue_ = false;
  local_b8 = &(this->SphereBRadius).super_ParameterBase;
  (this->SphereBRadius).super_ParameterBase.empty_ = true;
  (this->SphereBRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  local_c0 = &(this->SelectionA).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_c0);
  local_c8 = &(this->SelectionB).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_c8);
  (this->DividingArea).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DividingArea).super_ParameterBase.keyword_.field_2;
  (this->DividingArea).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DividingArea).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DividingArea).super_ParameterBase.optional_ = false;
  (this->DividingArea).super_ParameterBase.defaultValue_ = false;
  local_100 = &(this->DividingArea).super_ParameterBase;
  (this->DividingArea).super_ParameterBase.empty_ = true;
  (this->DividingArea).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  local_d0 = &(this->CoordinateOrigin).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_d0);
  local_d8 = &(this->OutputFileName).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_d8);
  local_e0 = &(this->OutputBins).super_ParameterBase;
  (this->OutputBins).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputBins).super_ParameterBase.keyword_.field_2;
  (this->OutputBins).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputBins).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputBins).super_ParameterBase.optional_ = false;
  (this->OutputBins).super_ParameterBase.defaultValue_ = false;
  (this->OutputBins).super_ParameterBase.empty_ = true;
  (this->OutputBins).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd5c8;
  (this->OutputBinWidth).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputBinWidth).super_ParameterBase.keyword_.field_2;
  (this->OutputBinWidth).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputBinWidth).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputBinWidth).super_ParameterBase.optional_ = false;
  (this->OutputBinWidth).super_ParameterBase.defaultValue_ = false;
  local_e8 = &(this->OutputBinWidth).super_ParameterBase;
  (this->OutputBinWidth).super_ParameterBase.empty_ = true;
  (this->OutputBinWidth).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  local_f8 = &(this->OutputFields).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_f8);
  this_01 = &this->PrivilegedAxis;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(this_01);
  (this->SPFScalingPower).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SPFScalingPower).super_ParameterBase.keyword_.field_2;
  (this->SPFScalingPower).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SPFScalingPower).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SPFScalingPower).super_ParameterBase.optional_ = false;
  (this->SPFScalingPower).super_ParameterBase.defaultValue_ = false;
  local_108 = &(this->SPFScalingPower).super_ParameterBase;
  (this->SPFScalingPower).super_ParameterBase.empty_ = true;
  (this->SPFScalingPower).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd5c8;
  (this->SPFUniformKineticScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SPFUniformKineticScaling).super_ParameterBase.keyword_.field_2;
  (this->SPFUniformKineticScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SPFUniformKineticScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SPFUniformKineticScaling).super_ParameterBase.optional_ = false;
  (this->SPFUniformKineticScaling).super_ParameterBase.defaultValue_ = false;
  local_110 = &(this->SPFUniformKineticScaling).super_ParameterBase;
  (this->SPFUniformKineticScaling).super_ParameterBase.empty_ = true;
  (this->SPFUniformKineticScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd4d8;
  this->calculateElectricField_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"useRNEMD",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->UseRNEMD).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  pPVar2 = local_38;
  (this->UseRNEMD).super_ParameterBase.optional_ = true;
  (this->UseRNEMD).super_ParameterBase.defaultValue_ = true;
  (this->UseRNEMD).super_ParameterBase.empty_ = false;
  (this->UseRNEMD).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"useRNEMD",&local_159);
  local_138.first._M_string_length = local_150;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_138.first.field_2;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_40;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"objectSelection",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->ObjectSelection).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->ObjectSelection).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"select all",(allocator<char> *)&local_158);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(pPVar2,&local_138.first);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"objectSelection",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = &pPVar2->super_ParameterBase;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  pPVar2 = local_48;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"method",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->Method).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->Method).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"VSS",(allocator<char> *)&local_158);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(pPVar2,&local_138.first);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"method",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = &pPVar2->super_ParameterBase;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"fluxType",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->FluxType).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->FluxType).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"fluxType",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_50;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"exchangeTime",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->ExchangeTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->ExchangeTime).super_ParameterBase.optional_ = true;
  (this->ExchangeTime).super_ParameterBase.defaultValue_ = true;
  (this->ExchangeTime).data_ = 100.0;
  (this->ExchangeTime).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"exchangeTime",&local_159)
  ;
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_58;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"kineticFlux",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->KineticFlux).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->KineticFlux).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"kineticFlux",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_60;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"particleFlux",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->ParticleFlux).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->ParticleFlux).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"particleFlux",&local_159)
  ;
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_68;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"currentDensity",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->CurrentDensity).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->CurrentDensity).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"currentDensity",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_70;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"momentumFlux",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->MomentumFlux).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->MomentumFlux).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"momentumFlux",&local_159)
  ;
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_78;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"momentumFluxVector",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign
            ((string *)&(this->MomentumFluxVector).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->MomentumFluxVector).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"momentumFluxVector",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_80;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"angularMomentumFlux",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign
            ((string *)&(this->AngularMomentumFlux).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->AngularMomentumFlux).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"angularMomentumFlux",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_88;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"angularMomentumFluxVector",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign
            ((string *)&(this->AngularMomentumFluxVector).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->AngularMomentumFluxVector).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"angularMomentumFluxVector",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_90;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"slabWidth",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SlabWidth).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SlabWidth).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"slabWidth",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_98;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"slabAcenter",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SlabACenter).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SlabACenter).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"slabAcenter",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_a0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"slabBcenter",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SlabBCenter).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SlabBCenter).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"slabBcenter",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_a8;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"sphereAradius",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SphereARadius).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SphereARadius).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"sphereAradius",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_b0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"sphereBradius",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SphereBRadius).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SphereBRadius).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"sphereBradius",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_b8;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"selectionA",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SelectionA).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SelectionA).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"selectionA",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_c0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"selectionB",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SelectionB).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SelectionB).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"selectionB",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_c8;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"coordinateOrigin",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->CoordinateOrigin).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->CoordinateOrigin).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"coordinateOrigin",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_d0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"outputFileName",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->OutputFileName).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->OutputFileName).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"outputFileName",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_d8;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"outputBins",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->OutputBins).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->OutputBins).super_ParameterBase.optional_ = true;
  (this->OutputBins).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->OutputBins).super_ParameterBase.field_0x2c = 0x14;
  (this->OutputBins).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"outputBins",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_e0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"outputBinWidth",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->OutputBinWidth).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->OutputBinWidth).super_ParameterBase.optional_ = true;
  (this->OutputBinWidth).super_ParameterBase.defaultValue_ = true;
  (this->OutputBinWidth).data_ = 2.0;
  (this->OutputBinWidth).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"outputBinWidth",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_e8;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"outputSelection",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->OutputSelection).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->OutputSelection).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"outputSelection",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_f0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"outputFields",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->OutputFields).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->OutputFields).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"outputFields",&local_159)
  ;
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_f8;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"dividingArea",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->DividingArea).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->DividingArea).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"dividingArea",&local_159)
  ;
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_100;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"privilegedAxis",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->PrivilegedAxis).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->PrivilegedAxis).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"z",(allocator<char> *)&local_158);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(this_01,&local_138.first);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"privilegedAxis",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_158 = &local_148;
  local_138.second = &this_01->super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"spfScalingPower",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign((string *)&(this->SPFScalingPower).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SPFScalingPower).super_ParameterBase.optional_ = true;
  (this->SPFScalingPower).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->SPFScalingPower).super_ParameterBase.field_0x2c = 3;
  (this->SPFScalingPower).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"spfScalingPower",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_108;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"spfUniformKineticScaling",(allocator<char> *)&local_158);
  std::__cxx11::string::_M_assign
            ((string *)&(this->SPFUniformKineticScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_138);
  (this->SPFUniformKineticScaling).super_ParameterBase.optional_ = true;
  (this->SPFUniformKineticScaling).super_ParameterBase.defaultValue_ = true;
  (this->SPFUniformKineticScaling).super_ParameterBase.empty_ = false;
  (this->SPFUniformKineticScaling).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"spfUniformKineticScaling",&local_159);
  local_138.first._M_string_length = local_150;
  if (local_158 == &local_148) {
    local_138.first.field_2._8_8_ = local_148._8_8_;
    local_138.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_138.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138.second = local_110;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  return;
}

Assistant:

RNEMDParameters::RNEMDParameters() {
    DefineOptionalParameterWithDefaultValue(UseRNEMD, "useRNEMD", false);
    DefineOptionalParameterWithDefaultValue(ObjectSelection, "objectSelection",
                                            "select all");

    DefineOptionalParameterWithDefaultValue(Method, "method", "VSS");
    DefineOptionalParameter(FluxType, "fluxType");

    DefineOptionalParameterWithDefaultValue(ExchangeTime, "exchangeTime",
                                            100.0);
    DefineOptionalParameter(KineticFlux, "kineticFlux");
    DefineOptionalParameter(ParticleFlux, "particleFlux");
    DefineOptionalParameter(CurrentDensity, "currentDensity");
    DefineOptionalParameter(MomentumFlux, "momentumFlux");
    DefineOptionalParameter(MomentumFluxVector, "momentumFluxVector");
    DefineOptionalParameter(AngularMomentumFlux, "angularMomentumFlux");
    DefineOptionalParameter(AngularMomentumFluxVector,
                            "angularMomentumFluxVector");
    DefineOptionalParameter(SlabWidth, "slabWidth");
    DefineOptionalParameter(SlabACenter, "slabAcenter");
    DefineOptionalParameter(SlabBCenter, "slabBcenter");
    DefineOptionalParameter(SphereARadius, "sphereAradius");
    DefineOptionalParameter(SphereBRadius, "sphereBradius");
    DefineOptionalParameter(SelectionA, "selectionA");
    DefineOptionalParameter(SelectionB, "selectionB");
    DefineOptionalParameter(CoordinateOrigin, "coordinateOrigin");
    DefineOptionalParameter(OutputFileName, "outputFileName");
    DefineOptionalParameterWithDefaultValue(OutputBins, "outputBins", 20);
    DefineOptionalParameterWithDefaultValue(OutputBinWidth, "outputBinWidth",
                                            2.0);
    DefineOptionalParameter(OutputSelection, "outputSelection");
    DefineOptionalParameter(OutputFields, "outputFields");
    DefineOptionalParameter(DividingArea, "dividingArea");
    DefineOptionalParameterWithDefaultValue(PrivilegedAxis, "privilegedAxis",
                                            "z");
    DefineOptionalParameterWithDefaultValue(SPFScalingPower, "spfScalingPower",
                                            3);
    DefineOptionalParameterWithDefaultValue(SPFUniformKineticScaling,
                                            "spfUniformKineticScaling", false);
  }